

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  bool bVar1;
  string makefileName;
  string generator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [48];
  undefined1 local_50 [48];
  
  local_50._8_8_ = local_50 + 0x10;
  local_50._0_8_ = &DAT_00000001;
  local_50[0x10] = '\"';
  local_80._8_8_ = (make->_M_dataplus)._M_p;
  local_80._0_8_ = make->_M_string_length;
  local_c0._M_dataplus._M_p._0_1_ = 0x22;
  cmStrCat<char>(__return_storage_ptr__,(cmAlphaNum *)local_50,(cmAlphaNum *)local_80,
                 (char *)&local_c0);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_50);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath((string *)local_80,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_c0);
    std::operator+(&local_a0,", \"",target);
    std::operator+(&local_c0,&local_a0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath((string *)local_80,makefile);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_c0);
      std::operator+(&local_a0,", \"",target);
      std::operator+(&local_c0,&local_a0,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      local_80._0_8_ = local_80 + 0x10;
      local_80._8_8_ = (pointer)0x0;
      local_80[0x10] = '\0';
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)local_80);
      }
      else {
        cmSystemTools::ConvertToOutputPath(&local_c0,makefile);
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_c0);
      std::operator+(&local_a0,", \"",target);
      std::operator+(&local_c0,&local_a0,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}